

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O2

void __thiscall
Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<double>_>::TypedAttribute
          (TypedAttribute<Imath_3_2::Matrix44<double>_> *this,Matrix44<double> *value)

{
  Attribute::Attribute(&this->super_Attribute);
  (this->super_Attribute)._vptr_Attribute = (_func_int **)&PTR__TypedAttribute_001e3988;
  Imath_3_2::Matrix44<double>::Matrix44(&this->_value,value);
  return;
}

Assistant:

TypedAttribute<T>::TypedAttribute (const T& value)
    : Attribute (), _value (value)
{
    // empty
}